

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# provider_core.c
# Opt level: O0

int provider_init(OSSL_PROVIDER *prov)

{
  int iVar1;
  int iVar2;
  DSO *pDVar3;
  provider_store_st *ppVar4;
  DSO_FUNC_TYPE pDVar5;
  undefined1 *puVar6;
  OSSL_FUNC_provider_gettable_params_fn *pOVar7;
  OSSL_FUNC_provider_get_params_fn *pOVar8;
  OSSL_FUNC_provider_self_test_fn *pOVar9;
  OSSL_FUNC_provider_get_capabilities_fn *pOVar10;
  OSSL_FUNC_provider_query_operation_fn *pOVar11;
  OSSL_FUNC_provider_unquery_operation_fn *pOVar12;
  OSSL_ITEM *num;
  char *pcVar13;
  void *pvVar14;
  byte *in_RDI;
  size_t cnt2;
  size_t cnt;
  OSSL_ITEM *reasonstrings;
  provider_store_st *store;
  char *allocated_load_dir;
  char *load_dir;
  char *merged_path;
  char *module_path;
  char *allocated_path;
  int ok;
  OSSL_FUNC_provider_get_reason_strings_fn *p_get_reason_strings;
  void *tmp_provctx;
  OSSL_DISPATCH *provider_dispatch;
  CRYPTO_RWLOCK *in_stack_ffffffffffffff88;
  OSSL_LIB_CTX *in_stack_ffffffffffffff90;
  char *pcVar15;
  undefined8 in_stack_ffffffffffffff98;
  long lVar16;
  char *in_stack_ffffffffffffffa0;
  char *local_48;
  char *local_40;
  char *local_38;
  char *local_30;
  int local_24;
  OSSL_FUNC_provider_get_reason_strings_fn *local_20;
  undefined8 local_18;
  OSSL_DISPATCH *local_10;
  byte *local_8;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  local_10 = (OSSL_DISPATCH *)0x0;
  local_18 = 0;
  local_20 = (OSSL_FUNC_provider_get_reason_strings_fn *)0x0;
  local_24 = 0;
  if ((*in_RDI & 1) != 0) {
    ERR_new();
    ERR_set_debug(in_stack_ffffffffffffffa0,iVar2,(char *)in_stack_ffffffffffffff90);
    ERR_set_error(0xf,0xc0103,(char *)0x0);
    return 0;
  }
  local_8 = in_RDI;
  if (*(long *)(in_RDI + 0x40) == 0) {
    if (*(long *)(in_RDI + 0x38) == 0) {
      local_30 = (char *)0x0;
      local_40 = (char *)0x0;
      local_48 = (char *)0x0;
      pDVar3 = DSO_new();
      *(DSO **)(local_8 + 0x38) = pDVar3;
      if (pDVar3 == (DSO *)0x0) {
        return 0;
      }
      ppVar4 = get_provider_store(in_stack_ffffffffffffff90);
      if (ppVar4 == (provider_store_st *)0x0) {
        return 0;
      }
      iVar1 = CRYPTO_THREAD_read_lock(in_stack_ffffffffffffff88);
      if (iVar1 == 0) {
        return 0;
      }
      if (ppVar4->default_path == (char *)0x0) {
        CRYPTO_THREAD_unlock(in_stack_ffffffffffffff88);
      }
      else {
        local_48 = CRYPTO_strdup(ppVar4->default_path,"crypto/provider_core.c",0x35b);
        CRYPTO_THREAD_unlock(in_stack_ffffffffffffff88);
        if (local_48 == (char *)0x0) {
          ERR_new();
          ERR_set_debug(in_stack_ffffffffffffffa0,iVar2,(char *)in_stack_ffffffffffffff90);
          ERR_set_error(0xf,0xc0100,(char *)0x0);
          return 0;
        }
      }
      pcVar13 = local_48;
      if ((local_48 == (char *)0x0) &&
         (local_48 = ossl_safe_getenv((char *)0x29446e), local_48 == (char *)0x0)) {
        local_48 = "/usr/local/lib64/ossl-modules";
      }
      DSO_ctrl(*(DSO **)(local_8 + 0x38),2,2,(void *)0x0);
      local_38 = *(char **)(local_8 + 0x30);
      if (local_38 == (char *)0x0) {
        local_38 = DSO_convert_filename(*(DSO **)(local_8 + 0x38),*(char **)(local_8 + 0x28));
        local_30 = local_38;
      }
      if (local_38 != (char *)0x0) {
        local_40 = DSO_merge(*(DSO **)(local_8 + 0x38),local_38,local_48);
      }
      if ((local_40 == (char *)0x0) ||
         (pDVar3 = DSO_load(*(DSO **)(local_8 + 0x38),local_40,(DSO_METHOD *)0x0,0),
         pDVar3 == (DSO *)0x0)) {
        DSO_free(*(DSO **)(local_8 + 0x38));
        local_8[0x38] = 0;
        local_8[0x39] = 0;
        local_8[0x3a] = 0;
        local_8[0x3b] = 0;
        local_8[0x3c] = 0;
        local_8[0x3d] = 0;
        local_8[0x3e] = 0;
        local_8[0x3f] = 0;
      }
      CRYPTO_free(local_40);
      CRYPTO_free(local_30);
      CRYPTO_free(pcVar13);
    }
    if (*(long *)(local_8 + 0x38) != 0) {
      pDVar5 = DSO_bind_func(*(DSO **)(local_8 + 0x38),"OSSL_provider_init");
      *(DSO_FUNC_TYPE *)(local_8 + 0x40) = pDVar5;
    }
  }
  if ((*(long *)(local_8 + 0x40) == 0) ||
     (iVar1 = (**(code **)(local_8 + 0x40))(local_8,core_dispatch,&local_10,&local_18), iVar1 == 0))
  {
    ERR_new();
    ERR_set_debug(in_stack_ffffffffffffffa0,iVar2,(char *)in_stack_ffffffffffffff90);
    ERR_set_error(0xf,0xc0105,"name=%s",*(undefined8 *)(local_8 + 0x28));
  }
  else {
    *(undefined8 *)(local_8 + 0xd0) = local_18;
    *(OSSL_DISPATCH **)(local_8 + 0xd8) = local_10;
    for (; local_10->function_id != 0; local_10 = local_10 + 1) {
      switch(local_10->function_id) {
      case 0x400:
        puVar6 = OSSL_FUNC_provider_teardown(local_10);
        *(undefined1 **)(local_8 + 0x70) = puVar6;
        break;
      case 0x401:
        pOVar7 = OSSL_FUNC_provider_gettable_params(local_10);
        *(OSSL_FUNC_provider_gettable_params_fn **)(local_8 + 0x78) = pOVar7;
        break;
      case 0x402:
        pOVar8 = OSSL_FUNC_provider_get_params(local_10);
        *(OSSL_FUNC_provider_get_params_fn **)(local_8 + 0x80) = pOVar8;
        break;
      case 0x403:
        pOVar11 = OSSL_FUNC_provider_query_operation(local_10);
        *(OSSL_FUNC_provider_query_operation_fn **)(local_8 + 0x98) = pOVar11;
        break;
      case 0x404:
        pOVar12 = OSSL_FUNC_provider_unquery_operation(local_10);
        *(OSSL_FUNC_provider_unquery_operation_fn **)(local_8 + 0xa0) = pOVar12;
        break;
      case 0x405:
        local_20 = OSSL_FUNC_provider_get_reason_strings(local_10);
        break;
      case 0x406:
        pOVar10 = OSSL_FUNC_provider_get_capabilities(local_10);
        *(OSSL_FUNC_provider_get_capabilities_fn **)(local_8 + 0x88) = pOVar10;
        break;
      case 0x407:
        pOVar9 = OSSL_FUNC_provider_self_test(local_10);
        *(OSSL_FUNC_provider_self_test_fn **)(local_8 + 0x90) = pOVar9;
      }
    }
    if (local_20 != (OSSL_FUNC_provider_get_reason_strings_fn *)0x0) {
      num = (*local_20)(*(void **)(local_8 + 0xd0));
      for (lVar16 = 0; num[lVar16].id != 0; lVar16 = lVar16 + 1) {
        iVar2 = ERR_GET_LIB((ulong)num[lVar16].id);
        if (iVar2 != 0) {
          return 0;
        }
      }
      pcVar13 = (char *)(lVar16 + 1);
      pvVar14 = CRYPTO_zalloc((size_t)num,pcVar13,(int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
      *(void **)(local_8 + 0x68) = pvVar14;
      if (*(long *)(local_8 + 0x68) == 0) {
        return 0;
      }
      **(long **)(local_8 + 0x68) = ((long)*(int *)(local_8 + 0x60) & 0xffU) << 0x17;
      *(undefined8 *)(*(long *)(local_8 + 0x68) + 8) = *(undefined8 *)(local_8 + 0x28);
      for (pcVar15 = (char *)0x1; pcVar15 <= pcVar13; pcVar15 = pcVar15 + 1) {
        *(long *)(*(long *)(local_8 + 0x68) + (long)pcVar15 * 0x10) =
             (long)(int)num[(long)(pcVar15 + -1)].id;
        *(void **)(*(long *)(local_8 + 0x68) + (long)pcVar15 * 0x10 + 8) =
             num[(long)(pcVar15 + -1)].ptr;
      }
      ERR_load_strings(*(int *)(local_8 + 0x60),*(ERR_STRING_DATA **)(local_8 + 0x68));
    }
    *local_8 = *local_8 & 0xfe | 1;
    local_24 = 1;
  }
  return local_24;
}

Assistant:

static int provider_init(OSSL_PROVIDER *prov)
{
    const OSSL_DISPATCH *provider_dispatch = NULL;
    void *tmp_provctx = NULL;    /* safety measure */
#ifndef OPENSSL_NO_ERR
# ifndef FIPS_MODULE
    OSSL_FUNC_provider_get_reason_strings_fn *p_get_reason_strings = NULL;
# endif
#endif
    int ok = 0;

    if (!ossl_assert(!prov->flag_initialized)) {
        ERR_raise(ERR_LIB_CRYPTO, ERR_R_INTERNAL_ERROR);
        goto end;
    }

    /*
     * If the init function isn't set, it indicates that this provider is
     * a loadable module.
     */
    if (prov->init_function == NULL) {
#ifdef FIPS_MODULE
        goto end;
#else
        if (prov->module == NULL) {
            char *allocated_path = NULL;
            const char *module_path = NULL;
            char *merged_path = NULL;
            const char *load_dir = NULL;
            char *allocated_load_dir = NULL;
            struct provider_store_st *store;

            if ((prov->module = DSO_new()) == NULL) {
                /* DSO_new() generates an error already */
                goto end;
            }

            if ((store = get_provider_store(prov->libctx)) == NULL
                    || !CRYPTO_THREAD_read_lock(store->default_path_lock))
                goto end;

            if (store->default_path != NULL) {
                allocated_load_dir = OPENSSL_strdup(store->default_path);
                CRYPTO_THREAD_unlock(store->default_path_lock);
                if (allocated_load_dir == NULL) {
                    ERR_raise(ERR_LIB_CRYPTO, ERR_R_MALLOC_FAILURE);
                    goto end;
                }
                load_dir = allocated_load_dir;
            } else {
                CRYPTO_THREAD_unlock(store->default_path_lock);
            }

            if (load_dir == NULL) {
                load_dir = ossl_safe_getenv("OPENSSL_MODULES");
                if (load_dir == NULL)
                    load_dir = MODULESDIR;
            }

            DSO_ctrl(prov->module, DSO_CTRL_SET_FLAGS,
                     DSO_FLAG_NAME_TRANSLATION_EXT_ONLY, NULL);

            module_path = prov->path;
            if (module_path == NULL)
                module_path = allocated_path =
                    DSO_convert_filename(prov->module, prov->name);
            if (module_path != NULL)
                merged_path = DSO_merge(prov->module, module_path, load_dir);

            if (merged_path == NULL
                || (DSO_load(prov->module, merged_path, NULL, 0)) == NULL) {
                DSO_free(prov->module);
                prov->module = NULL;
            }

            OPENSSL_free(merged_path);
            OPENSSL_free(allocated_path);
            OPENSSL_free(allocated_load_dir);
        }

        if (prov->module != NULL)
            prov->init_function = (OSSL_provider_init_fn *)
                DSO_bind_func(prov->module, "OSSL_provider_init");
#endif
    }

    /* Call the initialise function for the provider. */
    if (prov->init_function == NULL
        || !prov->init_function((OSSL_CORE_HANDLE *)prov, core_dispatch,
                                &provider_dispatch, &tmp_provctx)) {
        ERR_raise_data(ERR_LIB_CRYPTO, ERR_R_INIT_FAIL,
                       "name=%s", prov->name);
        goto end;
    }
    prov->provctx = tmp_provctx;
    prov->dispatch = provider_dispatch;

    for (; provider_dispatch->function_id != 0; provider_dispatch++) {
        switch (provider_dispatch->function_id) {
        case OSSL_FUNC_PROVIDER_TEARDOWN:
            prov->teardown =
                OSSL_FUNC_provider_teardown(provider_dispatch);
            break;
        case OSSL_FUNC_PROVIDER_GETTABLE_PARAMS:
            prov->gettable_params =
                OSSL_FUNC_provider_gettable_params(provider_dispatch);
            break;
        case OSSL_FUNC_PROVIDER_GET_PARAMS:
            prov->get_params =
                OSSL_FUNC_provider_get_params(provider_dispatch);
            break;
        case OSSL_FUNC_PROVIDER_SELF_TEST:
            prov->self_test =
                OSSL_FUNC_provider_self_test(provider_dispatch);
            break;
        case OSSL_FUNC_PROVIDER_GET_CAPABILITIES:
            prov->get_capabilities =
                OSSL_FUNC_provider_get_capabilities(provider_dispatch);
            break;
        case OSSL_FUNC_PROVIDER_QUERY_OPERATION:
            prov->query_operation =
                OSSL_FUNC_provider_query_operation(provider_dispatch);
            break;
        case OSSL_FUNC_PROVIDER_UNQUERY_OPERATION:
            prov->unquery_operation =
                OSSL_FUNC_provider_unquery_operation(provider_dispatch);
            break;
#ifndef OPENSSL_NO_ERR
# ifndef FIPS_MODULE
        case OSSL_FUNC_PROVIDER_GET_REASON_STRINGS:
            p_get_reason_strings =
                OSSL_FUNC_provider_get_reason_strings(provider_dispatch);
            break;
# endif
#endif
        }
    }

#ifndef OPENSSL_NO_ERR
# ifndef FIPS_MODULE
    if (p_get_reason_strings != NULL) {
        const OSSL_ITEM *reasonstrings = p_get_reason_strings(prov->provctx);
        size_t cnt, cnt2;

        /*
         * ERR_load_strings() handles ERR_STRING_DATA rather than OSSL_ITEM,
         * although they are essentially the same type.
         * Furthermore, ERR_load_strings() patches the array's error number
         * with the error library number, so we need to make a copy of that
         * array either way.
         */
        cnt = 0;
        while (reasonstrings[cnt].id != 0) {
            if (ERR_GET_LIB(reasonstrings[cnt].id) != 0)
                goto end;
            cnt++;
        }
        cnt++;                   /* One for the terminating item */

        /* Allocate one extra item for the "library" name */
        prov->error_strings =
            OPENSSL_zalloc(sizeof(ERR_STRING_DATA) * (cnt + 1));
        if (prov->error_strings == NULL)
            goto end;

        /*
         * Set the "library" name.
         */
        prov->error_strings[0].error = ERR_PACK(prov->error_lib, 0, 0);
        prov->error_strings[0].string = prov->name;
        /*
         * Copy reasonstrings item 0..cnt-1 to prov->error_trings positions
         * 1..cnt.
         */
        for (cnt2 = 1; cnt2 <= cnt; cnt2++) {
            prov->error_strings[cnt2].error = (int)reasonstrings[cnt2-1].id;
            prov->error_strings[cnt2].string = reasonstrings[cnt2-1].ptr;
        }

        ERR_load_strings(prov->error_lib, prov->error_strings);
    }
# endif
#endif

    /* With this flag set, this provider has become fully "loaded". */
    prov->flag_initialized = 1;
    ok = 1;

 end:
    return ok;
}